

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark_branchfree.cpp
# Opt level: O1

vector<short,_std::allocator<short>_> *
get_primes<short,short>(vector<short,_std::allocator<short>_> *__return_storage_ptr__,short max)

{
  iterator __position;
  long lVar1;
  size_t j;
  ulong uVar2;
  undefined6 in_register_00000032;
  ulong uVar3;
  vector<char,_std::allocator<char>_> sieve;
  short local_44;
  allocator_type local_41;
  vector<char,_std::allocator<char>_> local_40;
  
  uVar3 = (ulong)(int)CONCAT62(in_register_00000032,max);
  local_44 = CONCAT11(local_44._1_1_,1);
  std::vector<char,_std::allocator<char>_>::vector
            (&local_40,uVar3 + 1,(value_type *)&local_44,&local_41);
  if (3 < (ushort)max) {
    lVar1 = 2;
    uVar2 = 4;
    do {
      if (uVar2 <= uVar3 &&
          local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar1] != '\0') {
        do {
          local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar2] = '\0';
          uVar2 = uVar2 + lVar1;
        } while (uVar2 <= uVar3);
      }
      lVar1 = lVar1 + 1;
      uVar2 = lVar1 * lVar1;
    } while (uVar2 < uVar3 || uVar2 - uVar3 == 0);
  }
  (__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (1 < (ushort)max) {
    uVar2 = 2;
    do {
      if (local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_start[uVar2] != '\0') {
        local_44 = (short)uVar2;
        __position._M_current =
             (__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<short,_std::allocator<short>_>::_M_realloc_insert<short>
                    (__return_storage_ptr__,__position,&local_44);
        }
        else {
          *__position._M_current = local_44;
          (__return_storage_ptr__->super__Vector_base<short,_std::allocator<short>_>)._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 <= uVar3);
  }
  if (local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<divider_type> get_primes(T max) {
    size_t n = (size_t)max;
    std::vector<char> sieve(n + 1, true);

    for (size_t i = 2; i * i <= n; i++)
        if (sieve[i])
            for (size_t j = i * i; j <= n; j += i) sieve[j] = false;

    std::vector<divider_type> primes;
    for (size_t i = 2; i <= n; i++)
        if (sieve[i]) primes.push_back((T)i);

    return primes;
}